

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssh.c
# Opt level: O2

void ssh_hostport_setup(char *host,int port,Conf *conf,char **savedhost,int *savedport,
                       char **loghost_ret)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  
  pcVar2 = conf_get_str(conf,9);
  if (loghost_ret != (char **)0x0) {
    *loghost_ret = pcVar2;
  }
  if (*pcVar2 != '\0') {
    pcVar2 = dupstr(pcVar2);
    *savedport = 0x16;
    pcVar3 = host_strrchr(pcVar2,0x3a);
    if (pcVar3 != (char *)0x0) {
      pcVar4 = host_strchr(pcVar2,0x3a);
      if ((pcVar3 == pcVar4) && (*pcVar3 = '\0', pcVar3[1] != '\0')) {
        iVar1 = atoi(pcVar3 + 1);
        *savedport = iVar1;
      }
    }
    pcVar3 = host_strduptrim(pcVar2);
    *savedhost = pcVar3;
    safefree(pcVar2);
    return;
  }
  pcVar2 = host_strduptrim(host);
  *savedhost = pcVar2;
  iVar1 = 0x16;
  if (-1 < port) {
    iVar1 = port;
  }
  *savedport = iVar1;
  return;
}

Assistant:

static void ssh_hostport_setup(const char *host, int port, Conf *conf,
                               char **savedhost, int *savedport,
                               char **loghost_ret)
{
    char *loghost = conf_get_str(conf, CONF_loghost);
    if (loghost_ret)
        *loghost_ret = loghost;

    if (*loghost) {
        char *tmphost;
        char *colon;

        tmphost = dupstr(loghost);
        *savedport = 22;               /* default ssh port */

        /*
         * A colon suffix on the hostname string also lets us affect
         * savedport. (Unless there are multiple colons, in which case
         * we assume this is an unbracketed IPv6 literal.)
         */
        colon = host_strrchr(tmphost, ':');
        if (colon && colon == host_strchr(tmphost, ':')) {
            *colon++ = '\0';
            if (*colon)
                *savedport = atoi(colon);
        }

        *savedhost = host_strduptrim(tmphost);
        sfree(tmphost);
    } else {
        *savedhost = host_strduptrim(host);
        if (port < 0)
            port = 22;                 /* default ssh port */
        *savedport = port;
    }
}